

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFPrimitiveReader.cpp
# Opt level: O3

EStatusCode __thiscall
CFFPrimitiveReader::ReadOffset(CFFPrimitiveReader *this,unsigned_long *outValue)

{
  int iVar1;
  EStatusCode EVar2;
  undefined4 extraout_var;
  ulong uVar3;
  unsigned_short shortBuffer;
  byte local_1b;
  ushort local_1a;
  
  EVar2 = eFailure;
  switch(this->mCurrentOffsize) {
  case '\x01':
    if (this->mInternalState == eFailure) {
      return eFailure;
    }
    iVar1 = (*(this->mCFFFile->super_IByteReader)._vptr_IByteReader[2])(this->mCFFFile,&local_1b,1);
    if (CONCAT44(extraout_var,iVar1) != 1) {
      this->mInternalState = eFailure;
      return eFailure;
    }
    uVar3 = (ulong)local_1b;
    break;
  case '\x02':
    EVar2 = ReadCard16(this,&local_1a);
    if (EVar2 != eSuccess) {
      return eFailure;
    }
    uVar3 = (ulong)local_1a;
    break;
  case '\x03':
    EVar2 = Read3ByteUnsigned(this,outValue);
    return EVar2;
  case '\x04':
    EVar2 = Read4ByteUnsigned(this,outValue);
    return EVar2;
  default:
    goto LAB_0019ee87;
  }
  *outValue = uVar3;
  EVar2 = eSuccess;
LAB_0019ee87:
  return EVar2;
}

Assistant:

EStatusCode CFFPrimitiveReader::ReadOffset(unsigned long& outValue)
{
	EStatusCode status = PDFHummus::eFailure;

	switch(mCurrentOffsize)
	{
		case 1:
			Byte byteBuffer;
			status = ReadCard8(byteBuffer);
			if(PDFHummus::eSuccess == status)
				outValue = byteBuffer;
			break;
		case 2:
			unsigned short shortBuffer;
			status = ReadCard16(shortBuffer);
			if(PDFHummus::eSuccess == status)
				outValue = shortBuffer;
			break;
		case 3:
			status = Read3ByteUnsigned(outValue);
			break;
		case 4:
			status = Read4ByteUnsigned(outValue);
			break;

	}

	return status;
}